

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O2

void __thiscall
NativeEntryPointData::AddWeakFuncRef
          (NativeEntryPointData *this,RecyclerWeakReference<Js::FunctionBody> *weakFuncRef,
          Recycler *recycler)

{
  Recycler *alloc;
  BaseDictionary<Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  RecyclerWeakReference<Js::FunctionBody> *weakFuncRef_local;
  
  this_00 = &((this->weakFuncRefSet).ptr)->
             super_BaseDictionary<Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ;
  data._32_8_ = weakFuncRef;
  if (this_00 ==
      (BaseDictionary<Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    local_50 = (undefined1  [8])
               &JsUtil::
                BaseHashSet<Memory::RecyclerWeakReference<Js::FunctionBody>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Memory::RecyclerWeakReference<Js::FunctionBody>*,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_1bc1b8b;
    data.filename._0_4_ = 0x74;
    alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_50);
    this_00 = (BaseDictionary<Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               *)new<Memory::Recycler>(0x38,alloc,0x37a1d4);
    JsUtil::
    BaseDictionary<Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_00,recycler,0);
    Memory::
    WriteBarrierPtr<JsUtil::BaseHashSet<Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Memory::RecyclerWeakReference<Js::FunctionBody>_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
    ::WriteBarrierSet(&this->weakFuncRefSet,
                      (BaseHashSet<Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Memory::RecyclerWeakReference<Js::FunctionBody>_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                       *)this_00);
  }
  JsUtil::
  BaseHashSet<Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Memory::RecyclerWeakReference<Js::FunctionBody>_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::AddNew((BaseHashSet<Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Memory::RecyclerWeakReference<Js::FunctionBody>_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            *)this_00,(RecyclerWeakReference<Js::FunctionBody> **)&data.line);
  return;
}

Assistant:

void 
NativeEntryPointData::AddWeakFuncRef(RecyclerWeakReference<FunctionBody> *weakFuncRef, Recycler *recycler)
{
    NativeEntryPointData::WeakFuncRefSet * weakFuncRefSet = this->weakFuncRefSet;
    if (weakFuncRefSet == nullptr)
    {
        weakFuncRefSet = RecyclerNew(recycler, WeakFuncRefSet, recycler);
        this->weakFuncRefSet = weakFuncRefSet;
    }
    weakFuncRefSet->AddNew(weakFuncRef);
}